

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonBlobChangePayloadSize(JsonParse *pParse,u32 i,u32 szPayload)

{
  uint N;
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  byte *pbVar8;
  byte *__src;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if (pParse->oom == '\0') {
    bVar4 = pParse->aBlob[i];
    bVar6 = bVar4 >> 4;
    uVar10 = 0xffffffff;
    if (bVar6 != 0xc) {
      uVar10 = (uint)(bVar6 == 0xd) * 2 | 0xfffffffc;
    }
    bVar3 = false;
    if (bVar4 < 0xc0) {
      uVar10 = 0;
    }
    bVar11 = false;
    iVar5 = 0;
    if (0xb < szPayload) {
      if (szPayload < 0x100) {
        iVar5 = 1;
        bVar3 = true;
        bVar11 = false;
      }
      else {
        bVar11 = szPayload < 0x10000;
        iVar5 = (uint)!bVar11 * 2 + 2;
        bVar3 = false;
      }
    }
    pbVar8 = pParse->aBlob + i;
    uVar10 = iVar5 + uVar10;
    if (uVar10 != 0) {
      N = pParse->nBlob + uVar10;
      if ((int)uVar10 < 1) {
        __src = pbVar8 + (1 - uVar10);
        uVar9 = ~i + pParse->nBlob + uVar10;
        pbVar1 = pbVar8;
LAB_001bc342:
        memmove(pbVar1 + 1,__src,(ulong)uVar9);
        pParse->nBlob = N;
        bVar2 = true;
      }
      else {
        if (N <= pParse->nBlobAlloc) {
LAB_001bc309:
          pbVar8 = pParse->aBlob + i;
          __src = pParse->aBlob + (ulong)i + 1;
          uVar9 = ~i + pParse->nBlob;
          pbVar1 = pbVar8 + uVar10;
          goto LAB_001bc342;
        }
        iVar5 = jsonBlobExpand(pParse,N);
        if (iVar5 == 0) goto LAB_001bc309;
        bVar2 = false;
      }
      if (!bVar2) goto LAB_001bc242;
    }
    bVar4 = *pbVar8 & 0xf;
    bVar6 = (byte)szPayload;
    if (szPayload < 0xc) {
      *pbVar8 = bVar4 | bVar6 << 4;
    }
    else if (bVar3) {
      *pbVar8 = bVar4 | 0xc0;
      pbVar8[1] = bVar6;
    }
    else {
      bVar7 = (byte)(szPayload >> 8);
      if (bVar11) {
        *pbVar8 = bVar4 | 0xd0;
        pbVar8[1] = bVar7;
        pbVar8[2] = bVar6;
      }
      else {
        *pbVar8 = bVar4 | 0xe0;
        pbVar8[1] = (byte)(szPayload >> 0x18);
        pbVar8[2] = (byte)(szPayload >> 0x10);
        pbVar8[3] = bVar7;
        pbVar8[4] = bVar6;
      }
    }
  }
  else {
LAB_001bc242:
    uVar10 = 0;
  }
  return uVar10;
}

Assistant:

static int jsonBlobChangePayloadSize(
  JsonParse *pParse,
  u32 i,
  u32 szPayload
){
  u8 *a;
  u8 szType;
  u8 nExtra;
  u8 nNeeded;
  int delta;
  if( pParse->oom ) return 0;
  a = &pParse->aBlob[i];
  szType = a[0]>>4;
  if( szType<=11 ){
    nExtra = 0;
  }else if( szType==12 ){
    nExtra = 1;
  }else if( szType==13 ){
    nExtra = 2;
  }else{
    nExtra = 4;
  }
  if( szPayload<=11 ){
    nNeeded = 0;
  }else if( szPayload<=0xff ){
    nNeeded = 1;
  }else if( szPayload<=0xffff ){
    nNeeded = 2;
  }else{
    nNeeded = 4;
  }
  delta = nNeeded - nExtra;
  if( delta ){
    u32 newSize = pParse->nBlob + delta;
    if( delta>0 ){
      if( newSize>pParse->nBlobAlloc && jsonBlobExpand(pParse, newSize) ){
        return 0;  /* OOM error.  Error state recorded in pParse->oom. */
      }
      a = &pParse->aBlob[i];
      memmove(&a[1+delta], &a[1], pParse->nBlob - (i+1));
    }else{
      memmove(&a[1], &a[1-delta], pParse->nBlob - (i+1-delta));
    }
    pParse->nBlob = newSize;
  }
  if( nNeeded==0 ){
    a[0] = (a[0] & 0x0f) | (szPayload<<4);
  }else if( nNeeded==1 ){
    a[0] = (a[0] & 0x0f) | 0xc0;
    a[1] = szPayload & 0xff;
  }else if( nNeeded==2 ){
    a[0] = (a[0] & 0x0f) | 0xd0;
    a[1] = (szPayload >> 8) & 0xff;
    a[2] = szPayload & 0xff;
  }else{
    a[0] = (a[0] & 0x0f) | 0xe0;
    a[1] = (szPayload >> 24) & 0xff;
    a[2] = (szPayload >> 16) & 0xff;
    a[3] = (szPayload >> 8) & 0xff;
    a[4] = szPayload & 0xff;
  }
  return delta;
}